

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,char *host,char *salt,char *key_type_name,
                 size_t key_type_len,char *key,size_t keylen,char *comment,size_t commentlen,
                 int typemask,libssh2_knownhost **store)

{
  libssh2_knownhost **pplVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  known_host *entry;
  char *pcVar5;
  size_t sVar6;
  libssh2_knownhost *plVar7;
  LIBSSH2_SESSION *pLVar8;
  long lStack_90;
  char *ptr;
  char *local_80;
  size_t ptrlen;
  known_host *local_70;
  char *local_68;
  char *local_60;
  size_t local_58;
  size_t local_50;
  libssh2_knownhost **local_48;
  size_t local_40;
  size_t local_38;
  
  local_48 = store;
  local_40 = commentlen;
  local_68 = comment;
  local_38 = keylen;
  local_80 = key;
  local_60 = key_type_name;
  local_50 = key_type_len;
  sVar4 = strlen(host);
  pLVar8 = hosts->session;
  if ((typemask & 0x3c0000U) == 0) {
    pcVar5 = "No key type set";
    lStack_90._0_4_ = -0x22;
LAB_00118361:
    iVar3 = _libssh2_error(pLVar8,(int)lStack_90,pcVar5);
    return iVar3;
  }
  entry = (known_host *)_libssh2_calloc(pLVar8,0x90);
  if (entry == (known_host *)0x0) {
    pLVar8 = hosts->session;
    pcVar5 = "Unable to allocate memory for known host entry";
    lStack_90._0_4_ = -6;
    goto LAB_00118361;
  }
  entry->typemask = typemask;
  if ((short)typemask == 3) {
LAB_001182ca:
    local_58 = sVar4;
    pcVar5 = (char *)(*hosts->session->alloc)(sVar4 + 1,&hosts->session->abstract);
    entry->name = pcVar5;
    local_70 = entry;
    if (pcVar5 == (char *)0x0) {
      iVar3 = _libssh2_error(hosts->session,-6,"Unable to allocate memory for host name");
      entry = local_70;
      goto LAB_0011857c;
    }
    memcpy(pcVar5,host,sVar4 + 1);
    lStack_90 = 0x20;
    ptrlen = local_58;
    entry = local_70;
  }
  else {
    if ((typemask & 0xffffU) != 2) {
      if ((typemask & 0xffffU) != 1) {
        iVar3 = _libssh2_error(hosts->session,-0x21,"Unknown host name type");
        goto LAB_0011857c;
      }
      goto LAB_001182ca;
    }
    iVar3 = _libssh2_base64_decode(hosts->session,&ptr,&ptrlen,host,sVar4);
    if (iVar3 != 0) goto LAB_0011857c;
    entry->name = ptr;
    entry->name_len = ptrlen;
    pLVar8 = hosts->session;
    sVar4 = strlen(salt);
    iVar3 = _libssh2_base64_decode(pLVar8,&ptr,&ptrlen,salt,sVar4);
    if (iVar3 != 0) goto LAB_0011857c;
    entry->salt = ptr;
    lStack_90 = 0x38;
  }
  *(size_t *)((long)&(entry->node).next + lStack_90) = ptrlen;
  if (((uint)typemask >> 0x11 & 1) == 0) {
    sVar6 = _libssh2_base64_encode(hosts->session,local_80,local_38,&ptr);
    if (sVar6 != 0) {
      entry->key = ptr;
      goto LAB_00118471;
    }
    pLVar8 = hosts->session;
    pcVar5 = "Unable to allocate memory for base64-encoded key";
  }
  else {
    sVar6 = local_38;
    if (local_38 == 0) {
      sVar6 = strlen(local_80);
    }
    pcVar5 = (char *)(*hosts->session->alloc)(sVar6 + 1,&hosts->session->abstract);
    entry->key = pcVar5;
    if (pcVar5 == (char *)0x0) {
      iVar3 = _libssh2_error(hosts->session,-6,"Unable to allocate memory for key");
      goto LAB_0011857c;
    }
    memcpy(pcVar5,local_80,sVar6 + 1);
    entry->key[sVar6] = '\0';
LAB_00118471:
    sVar2 = local_40;
    sVar6 = local_50;
    if ((typemask & 0x3c0000U) == 0x3c0000 && local_60 != (char *)0x0) {
      pcVar5 = (char *)(*hosts->session->alloc)(local_50 + 1,&hosts->session->abstract);
      entry->key_type_name = pcVar5;
      if (pcVar5 == (char *)0x0) {
        pLVar8 = hosts->session;
        pcVar5 = "Unable to allocate memory for key type";
        goto LAB_0011856e;
      }
      memcpy(pcVar5,local_60,sVar6);
      entry->key_type_name[sVar6] = '\0';
      entry->key_type_len = sVar6;
    }
    if (local_68 == (char *)0x0) {
      entry->comment = (char *)0x0;
LAB_00118509:
      _libssh2_list_add(&hosts->head,&entry->node);
      pplVar1 = local_48;
      if (local_48 == (libssh2_knownhost **)0x0) {
        return 0;
      }
      plVar7 = knownhost_to_external(entry);
      *pplVar1 = plVar7;
      return 0;
    }
    pcVar5 = (char *)(*hosts->session->alloc)(sVar2 + 1,&hosts->session->abstract);
    entry->comment = pcVar5;
    if (pcVar5 != (char *)0x0) {
      memcpy(pcVar5,local_68,sVar2 + 1);
      entry->comment[sVar2] = '\0';
      entry->comment_len = sVar2;
      goto LAB_00118509;
    }
    pLVar8 = hosts->session;
    pcVar5 = "Unable to allocate memory for comment";
  }
LAB_0011856e:
  iVar3 = _libssh2_error(pLVar8,-6,pcVar5);
LAB_0011857c:
  free_host(hosts->session,entry);
  return iVar3;
}

Assistant:

static int
knownhost_add(LIBSSH2_KNOWNHOSTS *hosts,
              const char *host, const char *salt,
              const char *key_type_name, size_t key_type_len,
              const char *key, size_t keylen,
              const char *comment, size_t commentlen,
              int typemask, struct libssh2_knownhost **store)
{
    struct known_host *entry;
    size_t hostlen = strlen(host);
    int rc;
    char *ptr;
    size_t ptrlen;

    /* make sure we have a key type set */
    if(!(typemask & LIBSSH2_KNOWNHOST_KEY_MASK))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "No key type set");

    entry = LIBSSH2_CALLOC(hosts->session, sizeof(struct known_host));
    if(!entry)
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for known host "
                              "entry");

    entry->typemask = typemask;

    switch(entry->typemask  & LIBSSH2_KNOWNHOST_TYPE_MASK) {
    case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
    case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
        entry->name = LIBSSH2_ALLOC(hosts->session, hostlen + 1);
        if(!entry->name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for host name");
            goto error;
        }
        memcpy(entry->name, host, hostlen + 1);
        entry->name_len = hostlen;
        break;
    case LIBSSH2_KNOWNHOST_TYPE_SHA1:
        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    host, hostlen);
        if(rc)
            goto error;
        entry->name = ptr;
        entry->name_len = ptrlen;

        rc = _libssh2_base64_decode(hosts->session, &ptr, &ptrlen,
                                    salt, strlen(salt));
        if(rc)
            goto error;
        entry->salt = ptr;
        entry->salt_len = ptrlen;
        break;
    default:
        rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                            "Unknown host name type");
        goto error;
    }

    if(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64) {
        /* the provided key is base64 encoded already */
        if(!keylen)
            keylen = strlen(key);
        entry->key = LIBSSH2_ALLOC(hosts->session, keylen + 1);
        if(!entry->key) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key");
            goto error;
        }
        memcpy(entry->key, key, keylen + 1);
        entry->key[keylen] = 0; /* force a terminating zero trailer */
    }
    else {
        /* key is raw, we base64 encode it and store it as such */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &ptr);
        if(!nlen) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for "
                                "base64-encoded key");
            goto error;
        }

        entry->key = ptr;
    }

    if(key_type_name && ((typemask & LIBSSH2_KNOWNHOST_KEY_MASK) ==
                          LIBSSH2_KNOWNHOST_KEY_UNKNOWN)) {
        entry->key_type_name = LIBSSH2_ALLOC(hosts->session, key_type_len + 1);
        if(!entry->key_type_name) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for key type");
            goto error;
        }
        memcpy(entry->key_type_name, key_type_name, key_type_len);
        entry->key_type_name[key_type_len] = 0;
        entry->key_type_len = key_type_len;
    }

    if(comment) {
        entry->comment = LIBSSH2_ALLOC(hosts->session, commentlen + 1);
        if(!entry->comment) {
            rc = _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                "Unable to allocate memory for comment");
            goto error;
        }
        memcpy(entry->comment, comment, commentlen + 1);
        entry->comment[commentlen] = 0; /* force a terminating zero trailer */
        entry->comment_len = commentlen;
    }
    else {
        entry->comment = NULL;
    }

    /* add this new host to the big list of known hosts */
    _libssh2_list_add(&hosts->head, &entry->node);

    if(store)
        *store = knownhost_to_external(entry);

    return LIBSSH2_ERROR_NONE;
error:
    free_host(hosts->session, entry);
    return rc;
}